

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lparser.cpp
# Opt level: O3

void close_func(LexState *ls)

{
  int iVar1;
  FuncState *fs;
  lua_State *L;
  Proto *pPVar2;
  TString *pTVar3;
  Instruction *pIVar4;
  int *piVar5;
  TValue *pTVar6;
  Proto **ppPVar7;
  LocVar *pLVar8;
  Upvaldesc *pUVar9;
  
  fs = ls->fs;
  L = ls->L;
  pPVar2 = fs->f;
  luaK_ret(fs,0,0);
  leaveblock(fs);
  if (-2 < (long)fs->pc) {
    pIVar4 = (Instruction *)
             luaM_realloc_(L,pPVar2->code,(long)pPVar2->sizecode << 2,(long)fs->pc << 2);
    pPVar2->code = pIVar4;
    iVar1 = fs->pc;
    pPVar2->sizecode = iVar1;
    if (-2 < (long)iVar1) {
      piVar5 = (int *)luaM_realloc_(L,pPVar2->lineinfo,(long)pPVar2->sizelineinfo << 2,
                                    (long)iVar1 << 2);
      pPVar2->lineinfo = piVar5;
      pPVar2->sizelineinfo = fs->pc;
      if (-2 < (long)fs->nk) {
        pTVar6 = (TValue *)luaM_realloc_(L,pPVar2->k,(long)pPVar2->sizek << 4,(long)fs->nk << 4);
        pPVar2->k = pTVar6;
        pPVar2->sizek = fs->nk;
        if (-2 < (long)fs->np) {
          ppPVar7 = (Proto **)luaM_realloc_(L,pPVar2->p,(long)pPVar2->sizep << 3,(long)fs->np << 3);
          pPVar2->p = ppPVar7;
          pPVar2->sizep = fs->np;
          if (0xe < (uint)((ulong)((long)fs->nlocvars + -0xfffffffffffffff) >> 0x3c)) {
            pLVar8 = (LocVar *)
                     luaM_realloc_(L,pPVar2->locvars,(long)pPVar2->sizelocvars << 4,
                                   (long)fs->nlocvars << 4);
            pPVar2->locvars = pLVar8;
            pPVar2->sizelocvars = (int)fs->nlocvars;
            pUVar9 = (Upvaldesc *)
                     luaM_realloc_(L,pPVar2->upvalues,(long)pPVar2->sizeupvalues << 4,
                                   (ulong)fs->nups << 4);
            pPVar2->upvalues = pUVar9;
            pPVar2->sizeupvalues = (uint)fs->nups;
            ls->fs = fs->prev;
            if (((ls->t).token & 0xfffffffeU) == 0x120) {
              pTVar3 = (ls->t).seminfo.ts;
              luaX_newstring(ls,(char *)(pTVar3 + 1),(pTVar3->tsv).len);
            }
            L->top = L->top + -1;
            if (0 < L->l_G->GCdebt) {
              luaC_step(L);
              return;
            }
            return;
          }
        }
      }
    }
  }
  luaM_toobig(L);
}

Assistant:

static void close_func (LexState *ls) {
  lua_State *L = ls->L;
  FuncState *fs = ls->fs;
  Proto *f = fs->f;
  luaK_ret(fs, 0, 0);  /* final return */
  leaveblock(fs);
  luaM_reallocvector(L, f->code, f->sizecode, fs->pc, Instruction);
  f->sizecode = fs->pc;
  luaM_reallocvector(L, f->lineinfo, f->sizelineinfo, fs->pc, int);
  f->sizelineinfo = fs->pc;
  luaM_reallocvector(L, f->k, f->sizek, fs->nk, TValue);
  f->sizek = fs->nk;
  luaM_reallocvector(L, f->p, f->sizep, fs->np, Proto *);
  f->sizep = fs->np;
  luaM_reallocvector(L, f->locvars, f->sizelocvars, fs->nlocvars, LocVar);
  f->sizelocvars = fs->nlocvars;
  luaM_reallocvector(L, f->upvalues, f->sizeupvalues, fs->nups, Upvaldesc);
  f->sizeupvalues = fs->nups;
  lua_assert(fs->bl == NULL);
  ls->fs = fs->prev;
  /* last token read was anchored in defunct function; must re-anchor it */
  anchor_token(ls);
  L->top--;  /* pop table of constants */
  luaC_checkGC(L);
}